

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDConstructGridGlobal.hpp
# Opt level: O3

forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> __thiscall
TasGrid::readNodeDataList<TasGrid::IO::mode_ascii_type>
          (TasGrid *this,istream *is,size_t num_dimensions,size_t num_outputs)

{
  undefined8 *puVar1;
  pointer num_entries;
  _Fwd_list_node_base *__to;
  undefined8 *puVar2;
  int iVar3;
  int v;
  vector<int,_std::allocator<int>_> local_68;
  vector<double,_std::allocator<double>_> local_50;
  
  *(undefined8 *)this = 0;
  num_entries = (pointer)num_outputs;
  ::std::istream::operator>>((istream *)is,(int *)&local_68);
  if (0 < (int)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start) {
    puVar2 = (undefined8 *)(void *)0x0;
    iVar3 = (int)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
    do {
      IO::readVector<TasGrid::IO::mode_ascii_type,int,unsigned_long>
                (&local_68,(IO *)is,(istream *)num_dimensions,(unsigned_long)num_entries);
      IO::readVector<TasGrid::IO::mode_ascii_type,double,unsigned_long>
                (&local_50,(IO *)is,(istream *)num_outputs,(unsigned_long)num_entries);
      puVar1 = (undefined8 *)operator_new(0x38);
      puVar1[1] = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      puVar1[2] = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      puVar1[3] = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      puVar1[4] = local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
      puVar1[5] = local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      puVar1[6] = local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      *puVar1 = puVar2;
      *(undefined8 **)this = puVar1;
      iVar3 = iVar3 + -1;
      num_entries = local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      puVar2 = puVar1;
    } while (iVar3 != 0);
  }
  return (_Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>)
         (_Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>)this;
}

Assistant:

std::forward_list<NodeData> readNodeDataList(std::istream &is, size_t num_dimensions, size_t num_outputs){
    std::forward_list<NodeData> data;
    int num_nodes = IO::readNumber<iomode, int>(is);

    for(int i=0; i<num_nodes; i++){
        data.emplace_front(NodeData{
                            IO::readVector<iomode, int>(is, num_dimensions), // point
                            IO::readVector<iomode, double>(is, num_outputs)  // value
                           });
    }

    return data;
}